

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

bool QObjectPrivate::removeConnection(Connection *c)

{
  long *plVar1;
  bool bVar2;
  int __sig;
  Type pQVar3;
  QBasicMutex *pQVar4;
  QBasicMutex *pQVar5;
  ConnectionData *this;
  QObject *extraout_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  ConnectionData *connections;
  QBasicMutex *receiverMutex;
  QBasicMutex *senderMutex;
  QObject *receiver;
  QOrderedMutexLocker locker;
  LockPolicy in_stack_ffffffffffffff64;
  QObject *sender;
  QBasicMutex *in_stack_ffffffffffffff80;
  Connection *in_stack_ffffffffffffff88;
  ConnectionData *in_stack_ffffffffffffff90;
  byte local_31;
  ConnectionData *local_30 [2];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == 0) {
    local_31 = 0;
  }
  else {
    pQVar3 = QBasicAtomicPointer<QObject>::loadRelaxed((QBasicAtomicPointer<QObject> *)0x401a21);
    if (pQVar3 == (Type)0x0) {
      local_31 = 0;
    }
    else {
      pQVar4 = signalSlotLock(*(QObject **)(in_RDI + 0x20));
      pQVar5 = signalSlotLock(pQVar3);
      local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_20._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QOrderedMutexLocker::QOrderedMutexLocker
                ((QOrderedMutexLocker *)in_stack_ffffffffffffff90,
                 (QBasicMutex *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      pQVar3 = QBasicAtomicPointer<QObject>::loadRelaxed((QBasicAtomicPointer<QObject> *)0x401abb);
      if (pQVar3 == (Type)0x0) {
        local_31 = 0;
        bVar2 = true;
      }
      else {
        get((QObject *)0x401ae8);
        QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadRelaxed
                  ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x401af4);
        ConnectionData::removeConnection(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        plVar1 = *(long **)(in_RDI + 0x20);
        __sig = (**(code **)*plVar1)();
        this = (ConnectionData *)
               QMetaObjectPrivate::signal
                         (__sig,(__sighandler_t)(ulong)(uint)((*(int *)(in_RDI + 0x54) << 5) >> 5));
        sender = extraout_RDX;
        local_30[0] = this;
        (**(code **)(*plVar1 + 0x58))(plVar1,local_30);
        if (pQVar5 != pQVar4) {
          QBasicMutex::unlock((QBasicMutex *)this);
        }
        ConnectionData::cleanOrphanedConnections(this,sender,in_stack_ffffffffffffff64);
        QBasicMutex::unlock((QBasicMutex *)this);
        QOrderedMutexLocker::dismiss((QOrderedMutexLocker *)local_20);
        bVar2 = false;
      }
      QOrderedMutexLocker::~QOrderedMutexLocker((QOrderedMutexLocker *)0x401bfb);
      if (!bVar2) {
        local_31 = 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_31 & 1);
}

Assistant:

inline bool QObjectPrivate::removeConnection(QObjectPrivate::Connection *c)
{
    if (!c)
        return false;
    QObject *receiver = c->receiver.loadRelaxed();
    if (!receiver)
        return false;

    QBasicMutex *senderMutex = signalSlotLock(c->sender);
    QBasicMutex *receiverMutex = signalSlotLock(receiver);

    QObjectPrivate::ConnectionData *connections;
    {
        QOrderedMutexLocker locker(senderMutex, receiverMutex);

        // load receiver once again and recheck to ensure nobody else has removed the connection in the meantime
        receiver = c->receiver.loadRelaxed();
        if (!receiver)
            return false;

        connections = QObjectPrivate::get(c->sender)->connections.loadRelaxed();
        Q_ASSERT(connections);
        connections->removeConnection(c);

        c->sender->disconnectNotify(QMetaObjectPrivate::signal(c->sender->metaObject(), c->signal_index));
        // We must not hold the receiver mutex, else we risk dead-locking; we also only need the sender mutex
        // It is however vital to hold the senderMutex before calling cleanOrphanedConnections, as otherwise
        // another thread might modify/delete the connection
        if (receiverMutex != senderMutex) {
            receiverMutex->unlock();
        }
        connections->cleanOrphanedConnections(c->sender, ConnectionData::AlreadyLockedAndTemporarilyReleasingLock);
        senderMutex->unlock(); // now both sender and receiver mutex have been manually unlocked
        locker.dismiss(); // so we dismiss the QOrderedMutexLocker
    }

    return true;
}